

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O2

int publishDeviceTwinGetMsg
              (MQTTTRANSPORT_HANDLE_DATA *transport_data,MQTT_DEVICE_TWIN_ITEM *mqtt_info)

{
  uint16_t packetId;
  int iVar1;
  STRING_HANDLE handle;
  char *topicName;
  MQTT_MESSAGE_HANDLE msgHandle;
  LOGGER_LOG p_Var2;
  
  handle = STRING_construct_sprintf("$iothub/twin/GET/?$rid=%u",(ulong)mqtt_info->packet_id);
  if (handle == (STRING_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x491;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"publishDeviceTwinGetMsg",0x490,1,"Failed constructing get Prop topic.");
    }
  }
  else {
    packetId = mqtt_info->packet_id;
    topicName = STRING_c_str(handle);
    msgHandle = mqttmessage_create(packetId,topicName,DELIVER_AT_MOST_ONCE,(uint8_t *)0x0,0);
    if (msgHandle == (MQTT_MESSAGE_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x499;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"publishDeviceTwinGetMsg",0x498,1,"Failed constructing mqtt message.");
      }
    }
    else {
      iVar1 = mqtt_client_publish(transport_data->mqttClient,msgHandle);
      if (iVar1 == 0) {
        DList_InsertTailList(&transport_data->ack_waiting_queue,&mqtt_info->entry);
        iVar1 = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0x4a0;
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                    ,"publishDeviceTwinGetMsg",0x49f,1,"Failed publishing to mqtt client.");
        }
      }
      mqttmessage_destroy(msgHandle);
    }
    STRING_delete(handle);
  }
  return iVar1;
}

Assistant:

static int publishDeviceTwinGetMsg(MQTTTRANSPORT_HANDLE_DATA* transport_data, MQTT_DEVICE_TWIN_ITEM* mqtt_info)
{
    int result;

    STRING_HANDLE msg_topic = STRING_construct_sprintf(GET_PROPERTIES_TOPIC, mqtt_info->packet_id);
    if (msg_topic == NULL)
    {
        LogError("Failed constructing get Prop topic.");
        result = MU_FAILURE;
    }
    else
    {
        MQTT_MESSAGE_HANDLE mqtt_get_msg = mqttmessage_create(mqtt_info->packet_id, STRING_c_str(msg_topic), DELIVER_AT_MOST_ONCE, NULL, 0);
        if (mqtt_get_msg == NULL)
        {
            LogError("Failed constructing mqtt message.");
            result = MU_FAILURE;
        }
        else
        {
            if (mqtt_client_publish(transport_data->mqttClient, mqtt_get_msg) != 0)
            {
                LogError("Failed publishing to mqtt client.");
                result = MU_FAILURE;
            }
            else
            {
                DList_InsertTailList(&transport_data->ack_waiting_queue, &mqtt_info->entry);
                result = 0;
            }
            mqttmessage_destroy(mqtt_get_msg);
        }
        STRING_delete(msg_topic);
    }

    return result;
}